

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall
QDateTimeEditPrivate::updateCache(QDateTimeEditPrivate *this,QVariant *val,QString *str)

{
  bool bVar1;
  long in_FS_OFFSET;
  State unusedState;
  int unused;
  undefined1 auStack_48 [16];
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = ::operator!=(val,&(this->super_QAbstractSpinBoxPrivate).cachedValue);
  if (!bVar1) {
    bVar1 = ::operator!=(str,&(this->super_QAbstractSpinBoxPrivate).cachedText);
    if ((!bVar1) && (this->cacheGuard != true)) goto LAB_003bf6cf;
  }
  this->cacheGuard = true;
  local_38.d = (str->d).d;
  local_38.ptr = (str->d).ptr;
  local_38.size = (str->d).size;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  auStack_48._12_4_ = QLineEdit::cursorPosition((this->super_QAbstractSpinBoxPrivate).edit);
  auStack_48._8_4_ = 0xaaaaaaaa;
  validateAndInterpret
            ((QDateTimeEditPrivate *)auStack_48,(QString *)this,(int *)&local_38,
             (State *)(auStack_48 + 0xc),(bool)((char)auStack_48 + '\b'));
  QDateTime::~QDateTime((QDateTime *)auStack_48);
  this->cacheGuard = false;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
LAB_003bf6cf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::updateCache(const QVariant &val, const QString &str) const
{
    if (val != cachedValue || str != cachedText || cacheGuard) {
        cacheGuard = true;
        QString copy = str;
        int unused = edit->cursorPosition();
        QValidator::State unusedState;
        validateAndInterpret(copy, unused, unusedState);
        cacheGuard = false;
    }
}